

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directory.cpp
# Opt level: O3

void __thiscall directory::shrink(directory *this)

{
  uint32_t uVar1;
  uint uVar2;
  uint32_t uVar3;
  size_t in_RCX;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *__buf;
  ulong uVar4;
  bucket bucket;
  fstream bucketFile;
  bucket local_270;
  string *local_248;
  undefined1 local_240 [528];
  
  if (this->bucket_size == 0) {
    uVar2 = 0;
  }
  else {
    local_248 = &this->typeName;
    uVar4 = 0;
    do {
      generateBucketFileName
                ((string *)&local_270,local_248,
                 (this->bucket_ids).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start[uVar4]);
      std::fstream::fstream(local_240,(string *)&local_270,_S_out|_S_in|_S_bin);
      __buf = extraout_RDX;
      if ((vector<index,_std::allocator<index>_> *)CONCAT44(local_270._4_4_,local_270.id) !=
          &local_270.indices) {
        operator_delete((undefined1 *)CONCAT44(local_270._4_4_,local_270.id),
                        (ulong)((long)&(local_270.indices.
                                        super__Vector_base<index,_std::allocator<index>_>._M_impl.
                                        super__Vector_impl_data._M_start)->file_id + 1));
        __buf = extraout_RDX_00;
      }
      local_270._4_4_ = local_270._4_4_ & 0xffffff00;
      local_270.depth = 1;
      local_270.indices.super__Vector_base<index,_std::allocator<index>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_270.indices.super__Vector_base<index,_std::allocator<index>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_270.indices.super__Vector_base<index,_std::allocator<index>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      ::bucket::read(&local_270,(int)local_240,__buf,in_RCX);
      uVar1 = ::bucket::getDepth(&local_270);
      uVar3 = this->depth;
      if (local_270.indices.super__Vector_base<index,_std::allocator<index>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_270.indices.super__Vector_base<index,_std::allocator<index>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_270.indices.super__Vector_base<index,_std::allocator<index>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_270.indices.super__Vector_base<index,_std::allocator<index>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      std::fstream::~fstream(local_240);
      if (uVar1 == uVar3) {
        return;
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 < this->bucket_size);
    uVar2 = this->bucket_size >> 1;
  }
  uVar3 = this->depth - 1;
  this->depth = uVar3;
  if (uVar3 != 0x1f) {
    (this->bucket_ids).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish =
         (this->bucket_ids).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish + (-1 - (ulong)(uint)~(-1 << ((byte)uVar3 & 0x1f)));
  }
  this->bucket_size = uVar2;
  return;
}

Assistant:

void directory::shrink() {
    for (int i = 0; i < bucket_size; ++i) {
        fstream bucketFile(generateBucketFileName(typeName, bucket_ids[i]), INOUTBIN);

        bucket bucket;

        bucket.read(bucketFile);

        if(bucket.getDepth() == depth) {
            return;
        }
    }

    depth--;

    for (int j = 0; j < 1 << depth; ++j) {
        bucket_ids.pop_back();
    }

    bucket_size = bucket_size >> 1;
}